

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

bool __thiscall
glslang::AccessChainTraverser::visitBinary
          (AccessChainTraverser *this,TVisit param_1,TIntermBinary *binary)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  long lVar4;
  long lVar5;
  undefined4 extraout_var_01;
  long lVar6;
  size_t sVar7;
  TString *pTVar8;
  int index;
  undefined4 in_register_00000034;
  long lVar9;
  TString memberName;
  char text [16];
  TPoolAllocator *local_70;
  char *local_68;
  size_type local_60;
  char local_58 [16];
  char local_48 [24];
  
  if ((binary->super_TIntermOperator).op == EOpIndexDirectStruct) {
    iVar2 = (*(binary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(binary,CONCAT44(in_register_00000034,param_1));
    plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xf0))
                               ((long *)CONCAT44(extraout_var,iVar2));
    cVar1 = (**(code **)(*plVar3 + 0x128))(plVar3);
    if (cVar1 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    lVar5 = plVar3[0xd];
    iVar2 = (*(binary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x33])(binary);
    lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x28))
                      ((long *)CONCAT44(extraout_var_00,iVar2));
    lVar5 = (**(code **)(**(long **)(*(long *)(lVar5 + 8) +
                                    (long)**(int **)(*(long *)(lVar4 + 0xc0) + 8) * 0x20) + 0x30))()
    ;
    local_70 = GetThreadPoolAllocator();
    local_68 = local_58;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        &local_70,*(long *)(lVar5 + 8),
                        *(long *)(lVar5 + 0x10) + *(long *)(lVar5 + 8));
    pTVar8 = &this->path;
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(pTVar8,"");
    if (iVar2 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(pTVar8,".");
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(pTVar8,local_68,local_60);
  }
  if ((binary->super_TIntermOperator).op == EOpIndexDirect) {
    iVar2 = (*(binary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x33])(binary);
    lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x28))
                      ((long *)CONCAT44(extraout_var_01,iVar2));
    pTVar8 = &this->path;
    lVar9 = 0;
    lVar4 = 0;
    while( true ) {
      lVar6 = *(long *)(lVar5 + 0xc0);
      if (lVar6 == 0) {
        lVar6 = 0;
      }
      else {
        lVar6 = (long)(int)((ulong)(*(long *)(lVar6 + 0x10) - *(long *)(lVar6 + 8)) >> 4);
      }
      if (lVar6 <= lVar4) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(pTVar8,"[");
      snprintf(local_48,0x10,"%d",(ulong)*(uint *)(*(long *)(*(long *)(lVar5 + 0xc0) + 8) + lVar9));
      local_70 = GetThreadPoolAllocator();
      local_68 = local_58;
      sVar7 = strlen(local_48);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_70,local_48,local_48 + sVar7);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_append(pTVar8,local_68,local_60);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(pTVar8,"]");
      lVar4 = lVar4 + 1;
      lVar9 = lVar9 + 0x10;
    }
  }
  return true;
}

Assistant:

bool visitBinary(TVisit, TIntermBinary* binary) override {
        if (binary->getOp() == EOpIndexDirectStruct)
        {
            const TTypeList& members = *binary->getLeft()->getType().getStruct();
            const TTypeLoc& member =
                members[binary->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst()];
            TString memberName = member.type->getFieldName();

            if (path != "")
                path.append(".");

            path.append(memberName);
        }

        if (binary->getOp() == EOpIndexDirect)
        {
            const TConstUnionArray& indices = binary->getRight()->getAsConstantUnion()->getConstArray();
            for (int index = 0; index < indices.size(); ++index)
            {
                path.append("[");
                path.append(String(indices[index].getIConst()));
                path.append("]");
            }
        }

        return true;
    }